

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_image_color_tint_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,rf_color color,void *dst,rf_int dst_size)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined8 uVar10;
  int iVar11;
  rf_color rVar12;
  long lVar13;
  long lVar14;
  void *src;
  long lVar15;
  short sVar16;
  int iVar17;
  int iVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  int iVar23;
  undefined4 local_84;
  long local_80;
  long local_78;
  void *local_70;
  rf_image *local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined1 local_48 [8];
  float fStack_40;
  float fStack_3c;
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar18;
  undefined6 uVar19;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (image.valid == true) {
    local_80 = (long)image.width;
    local_78 = (long)image.height;
    iVar11 = rf_bits_per_pixel(image.format);
    iVar11 = iVar11 * image.height * image.width;
    iVar17 = iVar11 + 7;
    if (-1 < iVar11) {
      iVar17 = iVar11;
    }
    if (iVar17 >> 3 <= dst_size) {
      if (image.format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
        lVar13 = *(long *)(&DAT_0017a718 + (ulong)(image.format - RF_UNCOMPRESSED_GRAYSCALE) * 8);
      }
      else {
        lVar13 = 0;
      }
      local_70 = dst;
      local_68 = __return_storage_ptr__;
      if (0 < (int)local_78) {
        auVar8[0xc] = color.a;
        auVar8._0_12_ = ZEXT712(0);
        auVar21._0_4_ = (float)((uint)color & 0xff);
        auVar21._4_4_ = (float)((uint)color >> 8 & 0xff);
        auVar21._8_4_ = (float)(int)CONCAT32(auVar8._10_3_,(ushort)color.b);
        auVar21._12_4_ = (float)(uint3)(auVar8._10_3_ >> 0x10);
        _local_48 = divps(auVar21,_DAT_00177ba0);
        local_60 = lVar13 * local_80;
        lVar15 = 0;
        local_58 = 0;
        do {
          lVar14 = local_80;
          local_50 = lVar15;
          if (0 < (int)local_80) {
            do {
              src = (void *)((lVar15 >> 0x20) + (long)image.data);
              rVar12 = rf_format_one_pixel_to_rgba32(src,image.format);
              auVar9[0xc] = rVar12.a;
              auVar9._0_12_ = ZEXT712(0);
              auVar20._0_4_ = (float)((uint)rVar12 & 0xff);
              auVar20._4_4_ = (float)((uint)rVar12 >> 8 & 0xff);
              auVar20._8_4_ = (float)(int)CONCAT32(auVar9._10_3_,(ushort)rVar12.b);
              auVar20._12_4_ = (float)(uint3)(auVar9._10_3_ >> 0x10);
              auVar21 = divps(auVar20,_DAT_00177ba0);
              iVar17 = (int)(auVar21._0_4_ * (float)local_48._0_4_ * (float)DAT_00177ba0);
              iVar11 = (int)(auVar21._4_4_ * (float)local_48._4_4_ * DAT_00177ba0._4_4_);
              iVar22 = (int)(auVar21._8_4_ * fStack_40 * DAT_00177ba0._8_4_);
              iVar23 = (int)(auVar21._12_4_ * fStack_3c * DAT_00177ba0._12_4_);
              sVar5 = (short)iVar17;
              cVar1 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar17 - (0xff < sVar5);
              sVar5 = (short)((uint)iVar17 >> 0x10);
              sVar16 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar17 >> 0x10) -
                                (0xff < sVar5),cVar1);
              sVar5 = (short)iVar11;
              cVar2 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar11 - (0xff < sVar5);
              sVar5 = (short)((uint)iVar11 >> 0x10);
              uVar18 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar11 >> 0x10) -
                                (0xff < sVar5),CONCAT12(cVar2,sVar16));
              sVar5 = (short)iVar22;
              cVar3 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar22 - (0xff < sVar5);
              sVar5 = (short)((uint)iVar22 >> 0x10);
              uVar19 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * (char)((uint)iVar22 >> 0x10) -
                                (0xff < sVar5),CONCAT14(cVar3,uVar18));
              sVar5 = (short)iVar23;
              cVar4 = (0 < sVar5) * (sVar5 < 0x100) * (char)iVar23 - (0xff < sVar5);
              sVar7 = (short)((uint)iVar23 >> 0x10);
              sVar5 = (short)((uint)uVar18 >> 0x10);
              sVar6 = (short)((uint6)uVar19 >> 0x20);
              sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * (char)((uint)iVar23 >> 0x10)
                                       - (0xff < sVar7),CONCAT16(cVar4,uVar19)) >> 0x30);
              local_84 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                  CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                           CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 -
                                                    (0xff < sVar5),
                                                    (0 < sVar16) * (sVar16 < 0x100) * cVar1 -
                                                    (0xff < sVar16))));
              rf_format_one_pixel(&local_84,RF_UNCOMPRESSED_R8G8B8A8,src,image.format);
              lVar15 = lVar15 + lVar13;
              lVar14 = lVar14 + -1;
            } while (lVar14 != 0);
          }
          local_58 = local_58 + 1;
          lVar15 = local_50 + local_60;
        } while (local_58 != local_78);
      }
      local_68->data = image.data;
      local_68->width = (int)image._8_8_;
      local_68->height = (int)((ulong)image._8_8_ >> 0x20);
      uVar10 = image._16_8_;
      local_68->format = (int)uVar10;
      local_68->valid = (_Bool)(char)((ulong)uVar10 >> 0x20);
      *(int3 *)&local_68->field_0x15 = (int3)((ulong)uVar10 >> 0x28);
      local_68->data = local_70;
      __return_storage_ptr__ = local_68;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_color_tint_to_buffer(rf_image image, rf_color color, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        if (dst_size >= rf_image_size(image))
        {
            int bpp = rf_bytes_per_pixel(image.format);

            float c_r = ((float) color.r) / 255.0f;
            float c_g = ((float) color.g) / 255.0f;
            float c_b = ((float) color.b) / 255.0f;
            float c_a = ((float) color.a) / 255.0f;

            for (rf_int y = 0; y < image.height; y++)
            {
                for (rf_int x = 0; x < image.width; x++)
                {
                    int   index = y * image.width + x;
                    void* src_pixel = ((unsigned char*)image.data) + index * bpp;
                    void* dst_pixel = ((unsigned char*)image.data) + index * bpp;

                    rf_color pixel_rgba32 = rf_format_one_pixel_to_rgba32(src_pixel, image.format);

                    pixel_rgba32.r = (unsigned char) (255.f * (((float)pixel_rgba32.r) / 255.f * c_r));
                    pixel_rgba32.g = (unsigned char) (255.f * (((float)pixel_rgba32.g) / 255.f * c_g));
                    pixel_rgba32.b = (unsigned char) (255.f * (((float)pixel_rgba32.b) / 255.f * c_b));
                    pixel_rgba32.a = (unsigned char) (255.f * (((float)pixel_rgba32.a) / 255.f * c_a));

                    rf_format_one_pixel(&pixel_rgba32, RF_UNCOMPRESSED_R8G8B8A8, dst_pixel, image.format);
                }
            }

            result = image;
            result.data = dst;
        }
    }

    return result;
}